

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchCommon.hpp
# Opt level: O2

void readEntry<std::_Deque_iterator<std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string*>>
               (_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                *iter,double *val)

{
  double dVar1;
  _Self local_30;
  
  std::
  _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  ::operator++(&local_30,iter,0);
  dVar1 = std::__cxx11::stod(local_30._M_cur,(size_t *)0x0);
  *val = dVar1;
  return;
}

Assistant:

void readEntry(StringListIterator &iter, double &val){
    val = std::stod(*iter++);
}